

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O2

Ptr __thiscall LinuxPortFactory::create(LinuxPortFactory *this,string *name)

{
  long lVar1;
  char *in_RDX;
  
  lVar1 = std::__cxx11::string::find(in_RDX,0x110b0b);
  if (lVar1 == -1) {
    std::__cxx11::string::find(in_RDX,0x110b12);
  }
  (**(code **)((name->_M_dataplus)._M_p + 0x38))(this,name);
  return (__uniq_ptr_data<SerialPort,_std::default_delete<SerialPort>,_true,_true>)
         (__uniq_ptr_data<SerialPort,_std::default_delete<SerialPort>,_true,_true>)this;
}

Assistant:

SerialPort::Ptr
LinuxPortFactory::create(const std::string& name)
{
    bool isUsb = false;

    if (name.find("ttyUSB") != std::string::npos ||
        name.find("ttyACM") != std::string::npos)
        isUsb = true;

    return create(name, isUsb);
}